

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

void __thiscall Analyser_overconstrained_Test::TestBody(Analyser_overconstrained_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  char *pcVar2;
  element_type *peVar3;
  size_type sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_248;
  AssertHelper local_1f8 [8];
  Message local_1f0 [8];
  shared_ptr<libcellml::AnalyserModel> local_1e8;
  Type local_1d8 [2];
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_1;
  allocator<char> local_1a9;
  string local_1a8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  vector<libcellml::Issue::ReferenceRule,_std::allocator<libcellml::Issue::ReferenceRule>_>
  local_170;
  vector local_158 [24];
  vector local_140 [31];
  ScopedTrace local_121;
  undefined1 local_120 [7];
  ScopedTrace gtest_trace_362;
  AnalyserPtr analyser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  iterator local_e0;
  size_type local_d8;
  undefined1 local_d0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedIssues;
  Message local_b0 [8];
  unsigned_long local_a8 [2];
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  allocator<char> local_71;
  string local_70 [32];
  string local_50 [32];
  undefined1 local_30 [8];
  ModelPtr model;
  ParserPtr parser;
  Analyser_overconstrained_Test *this_local;
  
  this_00 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"analyser/overconstrained.cellml",&local_71);
  fileContents(local_50);
  libcellml::Parser::parseModel((string *)local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  local_a8[1] = 0;
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_a8[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_98,"size_t(0)","parser->issueCount()",local_a8 + 1,local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &expectedIssues.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x15b,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &expectedIssues.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,local_b0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &expectedIssues.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,
             "Variable \'x\' in component \'my_component\' is computed more than once.",
             (allocator<char> *)
             ((long)&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _6_1_ = 0;
  local_e0 = &local_100;
  local_d8 = 1;
  this_01 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 5);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this_01);
  __l._M_len = local_d8;
  __l._M_array = local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_d0,__l,this_01);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi + 5));
  local_248 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0;
  do {
    local_248 = local_248 + -1;
    std::__cxx11::string::~string((string *)local_248);
  } while (local_248 != &local_100);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Analyser::create();
  peVar3 = std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_120);
  libcellml::Analyser::analyseModel((shared_ptr *)peVar3);
  testing::ScopedTrace::ScopedTrace
            (&local_121,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
             ,0x16a,"Issue occurred here.");
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_d0);
  expectedCellmlElementTypes((ulong)local_140,(CellmlElementType)sVar4);
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_d0);
  expectedLevels((ulong)local_158,(Level)sVar4);
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_d0);
  expectedReferenceRules((ulong)&local_170,(ReferenceRule)sVar4);
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1a8,
             "https://libcellml.org/documentation/guides/latest/runtime_codes/index?issue=ANALYSER_VARIABLE_COMPUTED_MORE_THAN_ONCE"
             ,&local_1a9);
  expectedUrls(&local_188,sVar4,local_1a8);
  std::shared_ptr<libcellml::Logger>::shared_ptr<libcellml::Analyser,void>
            ((shared_ptr<libcellml::Logger> *)&gtest_ar_1.message_,
             (shared_ptr<libcellml::Analyser> *)local_120);
  expectEqualIssuesCellmlElementTypesLevelsReferenceRulesUrls
            ((vector *)local_d0,local_140,local_158,(vector *)&local_170,(vector *)&local_188,
             (shared_ptr *)&gtest_ar_1.message_);
  std::shared_ptr<libcellml::Logger>::~shared_ptr
            ((shared_ptr<libcellml::Logger> *)&gtest_ar_1.message_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_188);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::vector<libcellml::Issue::ReferenceRule,_std::allocator<libcellml::Issue::ReferenceRule>_>::
  ~vector(&local_170);
  std::vector<libcellml::Issue::Level,_std::allocator<libcellml::Issue::Level>_>::~vector
            ((vector<libcellml::Issue::Level,_std::allocator<libcellml::Issue::Level>_> *)local_158)
  ;
  std::vector<libcellml::CellmlElementType,_std::allocator<libcellml::CellmlElementType>_>::~vector
            ((vector<libcellml::CellmlElementType,_std::allocator<libcellml::CellmlElementType>_> *)
             local_140);
  local_1d8[1] = 6;
  std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_120);
  libcellml::Analyser::model();
  std::__shared_ptr_access<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&local_1e8);
  local_1d8[0] = libcellml::AnalyserModel::type();
  testing::internal::EqHelper<false>::
  Compare<libcellml::AnalyserModel::Type,libcellml::AnalyserModel::Type>
            ((EqHelper<false> *)local_1d0,"libcellml::AnalyserModel::Type::OVERCONSTRAINED",
             "analyser->model()->type()",local_1d8 + 1,local_1d8);
  std::shared_ptr<libcellml::AnalyserModel>::~shared_ptr(&local_1e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(local_1f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              (local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x16c,pcVar2);
    testing::internal::AssertHelper::operator=(local_1f8,local_1f0);
    testing::internal::AssertHelper::~AssertHelper(local_1f8);
    testing::Message::~Message(local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  testing::ScopedTrace::~ScopedTrace(&local_121);
  std::shared_ptr<libcellml::Analyser>::~shared_ptr((shared_ptr<libcellml::Analyser> *)local_120);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d0);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_30);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Analyser, overconstrained)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("analyser/overconstrained.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    const std::vector<std::string> expectedIssues = {
        "Variable 'x' in component 'my_component' is computed more than once.",
    };

    auto analyser = libcellml::Analyser::create();

    analyser->analyseModel(model);

    EXPECT_EQ_ISSUES_CELLMLELEMENTTYPES_LEVELS_REFERENCERULES_URLS(expectedIssues,
                                                                   expectedCellmlElementTypes(expectedIssues.size(), libcellml::CellmlElementType::VARIABLE),
                                                                   expectedLevels(expectedIssues.size(), libcellml::Issue::Level::ERROR),
                                                                   expectedReferenceRules(expectedIssues.size(), libcellml::Issue::ReferenceRule::ANALYSER_VARIABLE_COMPUTED_MORE_THAN_ONCE),
                                                                   expectedUrls(expectedIssues.size(), "https://libcellml.org/documentation/guides/latest/runtime_codes/index?issue=ANALYSER_VARIABLE_COMPUTED_MORE_THAN_ONCE"),
                                                                   analyser);

    EXPECT_EQ(libcellml::AnalyserModel::Type::OVERCONSTRAINED, analyser->model()->type());
}